

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.h
# Opt level: O0

void av1_refresh_search_site_config
               (search_site_config *ss_cfg_buf,SEARCH_METHODS search_method,int ref_stride)

{
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  int level;
  bool local_15;
  
  local_15 = in_SIL == 2 || in_SIL == 3;
  (*av1_init_motion_compensation[""[in_SIL]])
            ((search_site_config *)(in_RDI + (ulong)""[in_SIL] * 0xc68),in_EDX,SUB14(local_15,0));
  return;
}

Assistant:

static inline void av1_refresh_search_site_config(
    search_site_config *ss_cfg_buf, SEARCH_METHODS search_method,
    const int ref_stride) {
  const int level =
      search_method == NSTEP_8PT || search_method == CLAMPED_DIAMOND;
  search_method = search_method_lookup[search_method];
  av1_init_motion_compensation[search_method](&ss_cfg_buf[search_method],
                                              ref_stride, level);
}